

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value,GLenum format,GLenum type)

{
  uint uVar1;
  GLenum GVar2;
  bool bVar3;
  GLuint GVar4;
  reference pixels;
  reference pixels_00;
  reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string local_198;
  Vector<int,_4> local_178;
  string local_168;
  Vector<int,_4> local_148;
  string local_138;
  uint local_114;
  void *pvStack_110;
  int i;
  Vector<int,_4> *map_data;
  GLuint m_buffer;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> out_data;
  GLuint local_c0;
  GLuint c_program;
  GLuint texture [2];
  ShortByteData<tcu::Vector<int,_4>_> d;
  int kSize;
  string local_60;
  GLuint local_3c;
  GLenum local_38;
  GLuint program;
  GLenum type_local;
  GLenum format_local;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *value_local;
  BasicAllFormatsLoadStoreComputeStage *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsLoadStoreComputeStage *this_local;
  
  local_38 = type;
  program = format;
  _type_local = expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenCS<tcu::Vector<int,4>>(&local_60,this,internalformat,expected_value);
  GVar4 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  local_3c = GVar4;
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
            ((ShortByteData<tcu::Vector<int,_4>_> *)texture,8,expected_value_local,value_local._4_4_
             ,program);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),2,&local_c0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,local_c0);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)(this + 8),0xde1,1,value_local._4_4_,8,8);
  bVar3 = glcts::anon_unknown_0::Shorts(value_local._4_4_);
  GVar4 = program;
  GVar2 = local_38;
  if (bVar3) {
    pixels = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &d.data.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    glu::CallLogWrapper::glTexSubImage2D
              ((CallLogWrapper *)(this + 8),0xde1,0,0,0,8,8,GVar4,GVar2,pixels);
  }
  else {
    bVar3 = glcts::anon_unknown_0::Bytes(value_local._4_4_);
    GVar4 = program;
    GVar2 = local_38;
    if (bVar3) {
      pixels_00 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)
                             &d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,0);
      glu::CallLogWrapper::glTexSubImage2D
                ((CallLogWrapper *)(this + 8),0xde1,0,0,0,8,8,GVar4,GVar2,pixels_00);
    }
    else {
      pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          texture,0);
      glu::CallLogWrapper::glTexSubImage2D
                ((CallLogWrapper *)(this + 8),0xde1,0,0,0,8,8,GVar4,GVar2,pvVar5);
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,c_program);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)(this + 8),0xde1,1,value_local._4_4_,8,8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_3c);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,local_c0,0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,c_program,0,'\x01',0,0x88b9,value_local._4_4_);
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,c_program);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),8);
  GenC<tcu::Vector<int,4>>
            ((string *)
             &out_data.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,this,_type_local);
  GVar4 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,
                     (string *)
                     &out_data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::__cxx11::string::~string
            ((string *)
             &out_data.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&m_buffer,0x40,
             (allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,0,(GLuint)map_data);
  pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                      &m_buffer,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x400,pvVar5,0x88e4);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),GVar4);
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  pvStack_110 = glu::CallLogWrapper::glMapBufferRange((CallLogWrapper *)(this + 8),0x90d2,0,0x400,1)
  ;
  local_114 = 0;
  do {
    if (0x3f < (int)local_114) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),2,&local_c0);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar4);
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 1;
LAB_01477787:
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&m_buffer);
      glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::~ShortByteData
                ((ShortByteData<tcu::Vector<int,_4>_> *)texture);
      return (bool)(this_local._7_1_ & 1);
    }
    bVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,
                       (ivec4 *)((long)pvStack_110 + (long)(int)local_114 * 0x10),_type_local,
                       value_local._4_4_);
    uVar1 = local_114;
    if (!bVar3) {
      tcu::Vector<int,_4>::Vector
                (&local_148,(Vector<int,_4> *)((long)pvStack_110 + (long)(int)local_114 * 0x10));
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_138,(ShaderImageLoadStoreBase *)this,&local_148);
      uVar6 = std::__cxx11::string::c_str();
      tcu::Vector<int,_4>::Vector(&local_178,_type_local);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_168,(ShaderImageLoadStoreBase *)this,&local_178);
      uVar7 = std::__cxx11::string::c_str();
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_198,(ShaderImageLoadStoreBase *)this,value_local._4_4_);
      uVar8 = std::__cxx11::string::c_str();
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s.\n",(ulong)uVar1,uVar6,uVar7
                 ,uVar8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),2,&local_c0);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar4);
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 0;
      goto LAB_01477787;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		GLuint program = CreateComputeProgram(GenCS(internalformat, expected_value));

		const int		 kSize = 8;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture[2];
		glGenTextures(2, texture);

		/* read texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[0]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
			if (Shorts(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
			else if (Bytes(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
			else
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		}
		/* write texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[1]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);

		glBindImageTexture(2, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(expected_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s.\n", i, ToString(map_data[i]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				glDeleteTextures(2, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);

		return true;
	}